

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O3

bool __thiscall OSSLEVPCMacAlgorithm::signFinal(OSSLEVPCMacAlgorithm *this,ByteString *signature)

{
  CMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uchar *out;
  size_t outLen;
  size_t local_30;
  
  bVar1 = MacAlgorithm::signFinal(&this->super_MacAlgorithm,signature);
  if (bVar1) {
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xb])(this);
    local_30 = CONCAT44(extraout_var,iVar2);
    ByteString::resize(signature,local_30);
    ctx = (CMAC_CTX *)this->curCTX;
    out = ByteString::operator[](signature,0);
    iVar2 = CMAC_Final(ctx,out,&local_30);
    bVar1 = iVar2 != 0;
    if (iVar2 == 0) {
      softHSMLog(3,"signFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0x83,"CMAC_Final failed");
    }
    else {
      ByteString::resize(signature,local_30);
    }
    CMAC_CTX_free((CMAC_CTX *)this->curCTX);
    this->curCTX = (CMAC_CTX *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OSSLEVPCMacAlgorithm::signFinal(ByteString& signature)
{
	if (!MacAlgorithm::signFinal(signature))
	{
		return false;
	}

	size_t outLen = getMacSize();
	signature.resize(outLen);

	if (!CMAC_Final(curCTX, &signature[0], &outLen))
	{
		ERROR_MSG("CMAC_Final failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	signature.resize(outLen);

	CMAC_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}